

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O1

vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *
mercatortile::children
          (vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *__return_storage_ptr__,
          Tile *tile)

{
  pointer *ppTVar1;
  iterator iVar2;
  Tile local_1c;
  
  (__return_storage_ptr__->
  super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c.x = tile->x * 2;
  local_1c.y = tile->y * 2;
  local_1c.z = tile->z + 1;
  iVar2._M_current =
       (__return_storage_ptr__->
       super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
    _M_realloc_insert<mercatortile::Tile>(__return_storage_ptr__,iVar2,&local_1c);
  }
  else {
    (iVar2._M_current)->z = local_1c.z;
    (iVar2._M_current)->x = local_1c.x;
    (iVar2._M_current)->y = local_1c.y;
    ppTVar1 = &(__return_storage_ptr__->
               super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  local_1c.x = tile->x * 2 + 1;
  local_1c.y = tile->y * 2;
  local_1c.z = tile->z + 1;
  iVar2._M_current =
       (__return_storage_ptr__->
       super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
    _M_realloc_insert<mercatortile::Tile>(__return_storage_ptr__,iVar2,&local_1c);
  }
  else {
    (iVar2._M_current)->z = local_1c.z;
    (iVar2._M_current)->x = local_1c.x;
    (iVar2._M_current)->y = local_1c.y;
    ppTVar1 = &(__return_storage_ptr__->
               super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  local_1c.x = tile->x * 2;
  local_1c.y = tile->y * 2 + 1;
  local_1c.z = tile->z + 1;
  iVar2._M_current =
       (__return_storage_ptr__->
       super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
    _M_realloc_insert<mercatortile::Tile>(__return_storage_ptr__,iVar2,&local_1c);
  }
  else {
    (iVar2._M_current)->z = local_1c.z;
    (iVar2._M_current)->x = local_1c.x;
    (iVar2._M_current)->y = local_1c.y;
    ppTVar1 = &(__return_storage_ptr__->
               super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  local_1c.x = tile->x * 2 + 1;
  local_1c.y = tile->y * 2 + 1;
  local_1c.z = tile->z + 1;
  iVar2._M_current =
       (__return_storage_ptr__->
       super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
    _M_realloc_insert<mercatortile::Tile>(__return_storage_ptr__,iVar2,&local_1c);
  }
  else {
    (iVar2._M_current)->z = local_1c.z;
    (iVar2._M_current)->x = local_1c.x;
    (iVar2._M_current)->y = local_1c.y;
    ppTVar1 = &(__return_storage_ptr__->
               super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Tile> children(const Tile &tile)
{
    vector<Tile> return_tiles;
    return_tiles.push_back(Tile{tile.x * 2, tile.y * 2, tile.z + 1});
    return_tiles.push_back(Tile{tile.x * 2 + 1, tile.y * 2, tile.z + 1});
    return_tiles.push_back(Tile{tile.x * 2, tile.y * 2 + 1, tile.z + 1});
    return_tiles.push_back(Tile{tile.x * 2 + 1, tile.y * 2 + 1, tile.z + 1});

    return return_tiles;
}